

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

String * kj::getStackTrace(void)

{
  String *in_RCX;
  String *in_RDI;
  ArrayPtr<void_*> space_00;
  ArrayPtr<void_*const> trace_00;
  String local_180;
  kj *local_168;
  void **ppvStack_160;
  String local_150;
  kj *local_138;
  void **local_130;
  undefined1 auStack_128 [8];
  ArrayPtr<void_*const> trace;
  void *space [32];
  
  ArrayPtr<void*>::ArrayPtr<32ul>((ArrayPtr<void*> *)&local_138,(void *(*) [32])&trace.size_);
  space_00.size_ = 2;
  space_00.ptr = local_130;
  _auStack_128 = getStackTrace(local_138,space_00,(uint)in_RCX);
  local_168 = (kj *)auStack_128;
  ppvStack_160 = trace.ptr;
  trace_00.size_ = (size_t)in_RCX;
  trace_00.ptr = trace.ptr;
  stringifyStackTraceAddresses(&local_150,(kj *)auStack_128,trace_00);
  stringifyStackTrace(&local_180,_auStack_128);
  str<kj::String,kj::String>(in_RDI,(kj *)&local_150,&local_180,in_RCX);
  String::~String(&local_180);
  String::~String(&local_150);
  return in_RDI;
}

Assistant:

String getStackTrace() {
  void* space[32];
  auto trace = getStackTrace(space, 2);
  return kj::str(stringifyStackTraceAddresses(trace), stringifyStackTrace(trace));
}